

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Script::~Script(Script *this)

{
  RuntimeID id_00;
  bool bVar1;
  element_type *this_00;
  reference ppVar2;
  reference puVar3;
  element_type *this_01;
  unsigned_long id;
  iterator __end2_1;
  iterator __begin2_1;
  LocalFunctionList *__range2_1;
  pair<const_Jinx::Variant,_Jinx::Variant> *e;
  iterator __end4;
  iterator __begin4;
  element_type *__range4;
  CollectionPtr c;
  Variant *s;
  iterator __end2;
  iterator __begin2;
  vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_> *__range2;
  Script *this_local;
  
  __end2 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::begin
                     (&this->m_stack);
  s = (Variant *)
      std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::end
                (&this->m_stack);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>_>
                                     *)&s), bVar1) {
    c.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>_>
         ::operator*(&__end2);
    bVar1 = Variant::IsCollection
                      ((Variant *)
                       c.
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
    if (bVar1) {
      Variant::GetCollection((Variant *)&__range4);
      this_00 = std::
                __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range4);
      __end4 = std::
               map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
               ::begin(this_00);
      e = (pair<const_Jinx::Variant,_Jinx::Variant> *)
          std::
          map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
          ::end(this_00);
      while (bVar1 = std::operator!=(&__end4,(_Self *)&e), bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator*
                           (&__end4);
        Variant::SetNull(&ppVar2->second);
        std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++(&__end4);
      }
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)&__range4);
    }
    __gnu_cxx::
    __normal_iterator<Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::begin
                       (&this->m_localFunctions);
  id = (unsigned_long)
       std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::end
                 (&this->m_localFunctions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>_>
                             *)&id), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>_>
             ::operator*(&__end2_1);
    id_00 = *puVar3;
    this_01 = std::
              __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_runtime);
    Runtime::UnregisterFunction(this_01,id_00);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>_>
    ::operator++(&__end2_1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&this->m_name);
  std::any::~any(&this->m_userContext);
  std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&this->m_library);
  std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::~vector
            (&this->m_localFunctions);
  std::
  vector<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
  ::~vector(&this->m_idIndexData);
  std::vector<unsigned_long,_Jinx::StaticAllocator<unsigned_long,_4096UL,_16UL>_>::~vector
            (&this->m_scopeStack);
  std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::~vector
            (&this->m_stack);
  std::
  vector<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
  ::~vector(&this->m_execution);
  StaticArena<4096UL,_16UL>::~StaticArena(&this->m_staticArena);
  std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr(&this->m_runtime);
  std::enable_shared_from_this<Jinx::Impl::Script>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Jinx::Impl::Script>);
  IScript::~IScript(&this->super_IScript);
  return;
}

Assistant:

inline_t Script::~Script()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_stack)
		{
			if (s.IsCollection())
			{
				auto c = s.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}

		// Unregister local functions
		for (auto id : m_localFunctions)
			m_runtime->UnregisterFunction(id);
	}